

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

pair<const_char_*,_unsigned_long> plot::utf8_clamp<char_const*>(char *first,char *last,size_t width)

{
  byte bVar1;
  byte *pbVar2;
  size_t request;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  
  sVar6 = width;
  sVar7 = width;
  if (first != last) {
    do {
      bVar1 = *first;
      uVar9 = 1;
      if ((((char)bVar1 < '\0') && (uVar9 = 2, (bVar1 & 0xe0) != 0xc0)) &&
         (uVar9 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar9 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      if (uVar9 == 0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = (uint)(*(byte *)((long)&detail::utf8_start_masks + (ulong)uVar9) & bVar1);
        if (1 < (int)(uVar9 - 1)) {
          do {
            uVar5 = uVar5 << 6;
            uVar9 = uVar9 - 1;
          } while (2 < (int)uVar9);
        }
      }
      bVar10 = true;
      puVar3 = &detail::unicode_tables<void>::zero_width;
      do {
        if ((puVar3[1] <= uVar5) && (uVar5 <= puVar3[2])) break;
        puVar3 = *(uint **)(puVar3 + (ulong)(*puVar3 <= uVar5) * 2 + 4);
        bVar10 = puVar3 != (uint *)0x0;
      } while (bVar10);
      if (bVar10) {
        uVar4 = 0;
      }
      else {
        bVar10 = true;
        puVar3 = &detail::unicode_tables<void>::double_width;
        do {
          if ((puVar3[1] <= uVar5) && (uVar5 <= puVar3[2])) break;
          puVar3 = *(uint **)(puVar3 + (ulong)(*puVar3 <= uVar5) * 2 + 4);
          bVar10 = puVar3 != (uint *)0x0;
        } while (bVar10);
        uVar4 = (ulong)bVar10 + 1;
      }
      uVar8 = 0;
      if (uVar4 <= sVar6) {
        uVar8 = uVar4;
      }
      sVar7 = sVar6 - uVar8;
      pbVar2 = (byte *)first;
      if (sVar6 < uVar4) break;
      while (first = last, pbVar2 != (byte *)last) {
        bVar1 = pbVar2[1];
        first = (char *)(pbVar2 + 1);
        if (((((bVar1 & 0xf8) == 0xf0) || ((bVar1 & 0xf0) == 0xe0)) || (-1 < (char)bVar1)) ||
           (pbVar2 = (byte *)first, (bVar1 & 0xe0) == 0xc0)) break;
      }
      sVar6 = sVar7;
    } while (first != last);
  }
  pVar11.second = width - sVar7;
  pVar11.first = first;
  return pVar11;
}

Assistant:

std::pair<Iterator, std::size_t> utf8_clamp(Iterator first, Iterator last, std::size_t width) {
    std::size_t request = width;

    for (; first != last; first = detail::utf8_next(first, last)) {
        auto cw = detail::wcwidth(detail::utf8_cp(first, last));
        if (cw > width)
            break;
        width -= cw;
    }

    return { first, request - width };
}